

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O3

void Abc_NtkMiterAddCone(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkMiter,Abc_Obj_t *pRoot)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *__ptr;
  char *__assertion;
  long lVar6;
  Abc_Obj_t *local_28;
  
  local_28 = pRoot;
  pAVar4 = Abc_AigConst1(pNtkMiter);
  pAVar5 = Abc_AigConst1(pNtk);
  (pAVar5->field_6).pCopy = pAVar4;
  __ptr = Abc_NtkDfsNodes(pNtk,&local_28,1);
  iVar3 = __ptr->nSize;
  if (0 < iVar3) {
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)__ptr->pArray[lVar6];
      if (((ulong)puVar1 & 1) != 0) {
        __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_002d7087:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                      ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
      }
      if (*(int *)*puVar1 != 3) {
        __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_002d7087;
      }
      if (*(int *)((long)puVar1 + 0x1c) == 2) {
        lVar2 = *(long *)(*(long *)((int *)*puVar1 + 8) + 8);
        pAVar4 = Abc_AigAnd((Abc_Aig_t *)pNtkMiter->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)((long)puVar1 + 0x14) >> 10 & 1) ^
                            *(ulong *)(*(long *)(lVar2 + (long)*(int *)puVar1[4] * 8) + 0x40)),
                            (Abc_Obj_t *)
                            ((ulong)(*(uint *)((long)puVar1 + 0x14) >> 0xb & 1) ^
                            *(ulong *)(*(long *)(lVar2 + (long)((int *)puVar1[4])[1] * 8) + 0x40)));
        puVar1[8] = pAVar4;
        iVar3 = __ptr->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkMiterAddCone( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkMiter, Abc_Obj_t * pRoot )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    // map the constant nodes
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkMiter);
    // perform strashing
    vNodes = Abc_NtkDfsNodes( pNtk, &pRoot, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        if ( Abc_AigNodeIsAnd(pNode) )
            pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
    Vec_PtrFree( vNodes );
}